

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search.cpp
# Opt level: O0

int main(void)

{
  initializer_list<long> __l;
  uint64_t uVar1;
  allocator<long> local_69;
  long local_68 [6];
  iterator local_38;
  size_type local_30;
  vector<long,_std::allocator<long>_> local_28;
  int local_c;
  
  local_c = 0;
  local_68[2] = 3;
  local_68[3] = 4;
  local_68[0] = 1;
  local_68[1] = 2;
  local_68[4] = 5;
  local_38 = local_68;
  local_30 = 5;
  std::allocator<long>::allocator(&local_69);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<long,_std::allocator<long>_>::vector(&local_28,__l,&local_69);
  uVar1 = binarySearch(&local_28,2);
  local_c = (int)uVar1;
  std::vector<long,_std::allocator<long>_>::~vector(&local_28);
  std::allocator<long>::~allocator(&local_69);
  return local_c;
}

Assistant:

int main()
{
  return binarySearch(std::vector<int64_t>{1,2,3,4,5}, 2);
}